

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  FileDescriptorProto *msg;
  ParseContext *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  HasBits has_bits;
  char **in_stack_ffffffffffffffa8;
  ParseContext *in_stack_ffffffffffffffb0;
  ParseContext *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffd0;
  HasBits<1UL> in_stack_ffffffffffffffd4;
  ParseContext *pPVar2;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  local_20 = in_RSI;
LAB_004b1f62:
  do {
    bVar1 = internal::ParseContext::Done(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_004b2245;
    local_20 = internal::ReadTag((char *)in_RDX,
                                 (uint32 *)
                                 CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                          in_stack_ffffffffffffffd0),(uint32)((ulong)in_RDI >> 0x20)
                                );
    if (local_20 == (char *)0x0) goto LAB_004b2262;
    msg = (FileDescriptorProto *)(ulong)((in_stack_ffffffffffffffd0 >> 3) - 1);
    switch(msg) {
    case (FileDescriptorProto *)0x0:
      if ((in_stack_ffffffffffffffd0 & 0xff) == 10) {
        do {
          _internal_add_file_to_generate_abi_cxx11_((CodeGeneratorRequest *)0x4b2016);
          local_20 = internal::InlineGreedyStringParserUTF8Verify
                               ((string *)msg,(char *)in_stack_ffffffffffffffb8,
                                in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          if (local_20 == (char *)0x0) goto LAB_004b2262;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<10u>(local_20), bVar1));
        goto LAB_004b1f62;
      }
      break;
    case (FileDescriptorProto *)0x1:
      if ((in_stack_ffffffffffffffd0 & 0xff) != 0x12) break;
      _internal_mutable_parameter_abi_cxx11_((CodeGeneratorRequest *)in_stack_ffffffffffffffb0);
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)msg,(char *)in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
      goto joined_r0x004b212b;
    case (FileDescriptorProto *)0x2:
      if ((in_stack_ffffffffffffffd0 & 0xff) == 0x1a) {
        pPVar2 = in_RDX;
        _internal_mutable_compiler_version((CodeGeneratorRequest *)in_stack_ffffffffffffffb0);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::compiler::Version>
                             (in_RDI,(Version *)msg,(char *)in_RDX);
        in_stack_ffffffffffffffb8 = in_RDX;
        in_RDX = pPVar2;
        goto joined_r0x004b212b;
      }
      break;
    default:
      break;
    case (FileDescriptorProto *)0xe:
      if ((in_stack_ffffffffffffffd0 & 0xff) == 0x7a) {
        do {
          in_stack_ffffffffffffffb0 = in_RDX;
          in_RDX = in_stack_ffffffffffffffb0;
          _internal_add_proto_file((CodeGeneratorRequest *)0x4b218a);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::FileDescriptorProto>
                               (in_RDI,msg,(char *)in_stack_ffffffffffffffb8);
          if (local_20 == (char *)0x0) goto LAB_004b2262;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<122u>(local_20), bVar1));
        goto LAB_004b1f62;
      }
    }
    if (((in_stack_ffffffffffffffd0 & 7) == 4) || (in_stack_ffffffffffffffd0 == 0)) {
      internal::EpsCopyInputStream::SetLastTag
                (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffd0);
      goto LAB_004b2245;
    }
    local_20 = internal::UnknownFieldParse
                         ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                          (InternalMetadataWithArena *)in_RDI,(char *)msg,in_stack_ffffffffffffffb8)
    ;
joined_r0x004b212b:
    if (local_20 == (char *)0x0) {
LAB_004b2262:
      local_20 = (char *)0x0;
LAB_004b2245:
      internal::HasBits<1UL>::Or
                ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
                 (HasBits<1UL> *)&stack0xffffffffffffffd4);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_file_to_generate(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_parameter(), ptr, ctx, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}